

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

XML_Char * poolAppend(STRING_POOL *pool,ENCODING *enc,char *ptr,char *end)

{
  XML_Bool XVar1;
  byte bVar2;
  XML_Convert_Result XVar3;
  char *local_30;
  
  local_30 = ptr;
  if ((pool->ptr != (XML_Char *)0x0) || (XVar1 = poolGrow(pool), XVar1 != '\0')) {
    do {
      XVar3 = (*enc->utf8Convert)(enc,&local_30,end,&pool->ptr,pool->end);
      bVar2 = 2;
      if (XML_CONVERT_INPUT_INCOMPLETE < XVar3) {
        bVar2 = poolGrow(pool);
        bVar2 = bVar2 ^ 1;
      }
    } while (bVar2 == 0);
    if (bVar2 != 1) {
      return pool->start;
    }
  }
  return (XML_Char *)0x0;
}

Assistant:

static XML_Char *
poolAppend(STRING_POOL *pool, const ENCODING *enc, const char *ptr,
           const char *end) {
  if (! pool->ptr && ! poolGrow(pool))
    return NULL;
  for (;;) {
    const enum XML_Convert_Result convert_res = XmlConvert(
        enc, &ptr, end, (ICHAR **)&(pool->ptr), (ICHAR *)pool->end);
    if ((convert_res == XML_CONVERT_COMPLETED)
        || (convert_res == XML_CONVERT_INPUT_INCOMPLETE))
      break;
    if (! poolGrow(pool))
      return NULL;
  }
  return pool->start;
}